

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::read_sos_marker(jpeg_decoder *this)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  byte *pbVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  
  iVar5 = this->m_bits_left;
  uVar13 = this->m_bit_buf;
  iVar4 = iVar5 + -0x10;
  this->m_bits_left = iVar4;
  if (iVar5 < 0x11) {
    this->m_bit_buf = uVar13 << ((byte)iVar5 & 0x1f);
    iVar4 = this->m_in_buf_left;
    if (iVar4 == 0) {
      prep_in_buffer(this);
      iVar4 = this->m_in_buf_left;
      if (iVar4 != 0) goto LAB_0011ed66;
      uVar10 = this->m_tem_flag;
      this->m_tem_flag = uVar10 ^ 1;
      uVar14 = 0xd9;
      if (uVar10 == 0) {
        uVar14 = 0xff;
      }
LAB_0011edb3:
      prep_in_buffer(this);
      iVar4 = this->m_in_buf_left;
      if (iVar4 != 0) {
        pbVar8 = this->m_pIn_buf_ofs;
        goto LAB_0011edd0;
      }
      uVar11 = this->m_tem_flag;
      this->m_tem_flag = uVar11 ^ 1;
      uVar10 = 0xd9;
      if (uVar11 == 0) {
        uVar10 = 0xff;
      }
    }
    else {
LAB_0011ed66:
      pbVar3 = this->m_pIn_buf_ofs;
      pbVar8 = pbVar3 + 1;
      this->m_pIn_buf_ofs = pbVar8;
      uVar14 = (uint)*pbVar3;
      iVar4 = iVar4 + -1;
      this->m_in_buf_left = iVar4;
      if (iVar4 == 0) goto LAB_0011edb3;
LAB_0011edd0:
      this->m_pIn_buf_ofs = pbVar8 + 1;
      bVar1 = *pbVar8;
      this->m_in_buf_left = iVar4 + -1;
      uVar10 = (uint)bVar1;
    }
    uVar14 = (uVar14 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar10) <<
             (-(char)this->m_bits_left & 0x1fU);
    iVar4 = this->m_bits_left + 0x10;
  }
  else {
    uVar14 = uVar13 << 0x10;
  }
  uVar10 = uVar14 >> 0x18;
  iVar5 = iVar4 + -8;
  this->m_bits_left = iVar5;
  if (iVar4 < 9) {
    this->m_bit_buf = uVar14 << ((byte)iVar4 & 0x1f);
    iVar4 = this->m_in_buf_left;
    if (iVar4 == 0) {
      prep_in_buffer(this);
      iVar4 = this->m_in_buf_left;
      if (iVar4 != 0) goto LAB_0011ee48;
      uVar6 = this->m_tem_flag;
      this->m_tem_flag = uVar6 ^ 1;
      uVar11 = 0xd9;
      if (uVar6 == 0) {
        uVar11 = 0xff;
      }
LAB_0011eec4:
      prep_in_buffer(this);
      iVar4 = this->m_in_buf_left;
      if (iVar4 != 0) {
        pbVar8 = this->m_pIn_buf_ofs;
        goto LAB_0011eee1;
      }
      uVar2 = this->m_tem_flag;
      this->m_tem_flag = uVar2 ^ 1;
      uVar6 = 0xd9;
      if (uVar2 == 0) {
        uVar6 = 0xff;
      }
    }
    else {
LAB_0011ee48:
      pbVar3 = this->m_pIn_buf_ofs;
      pbVar8 = pbVar3 + 1;
      this->m_pIn_buf_ofs = pbVar8;
      uVar11 = (uint)*pbVar3;
      iVar4 = iVar4 + -1;
      this->m_in_buf_left = iVar4;
      if (iVar4 == 0) goto LAB_0011eec4;
LAB_0011eee1:
      this->m_pIn_buf_ofs = pbVar8 + 1;
      bVar1 = *pbVar8;
      this->m_in_buf_left = iVar4 + -1;
      uVar6 = (uint)bVar1;
    }
    uVar12 = (uVar11 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar6) <<
             (-(char)this->m_bits_left & 0x1fU);
    this->m_bit_buf = uVar12;
    iVar5 = this->m_bits_left + 0x10;
    this->m_bits_left = iVar5;
  }
  else {
    uVar12 = uVar14 << 8;
    this->m_bit_buf = uVar12;
  }
  this->m_comps_in_scan = uVar10;
  if ((uVar10 - 5 < 0xfffffffc) || (uVar13 >> 0x10 != uVar10 * 2 + 6)) {
    stop_decoding(this,JPGD_BAD_SOS_LENGTH);
  }
  iVar4 = (uVar13 >> 0x10) - 3;
  if (0xffffff < uVar14) {
    iVar4 = iVar4 + uVar10 * -2;
    uVar15 = 0;
    do {
      iVar9 = this->m_bits_left;
      uVar13 = this->m_bit_buf;
      iVar5 = iVar9 + -8;
      this->m_bits_left = iVar5;
      if (iVar9 < 9) {
        this->m_bit_buf = uVar13 << ((byte)iVar9 & 0x1f);
        iVar5 = this->m_in_buf_left;
        if (iVar5 == 0) {
          prep_in_buffer(this);
          iVar5 = this->m_in_buf_left;
          if (iVar5 != 0) goto LAB_0011efb2;
          uVar11 = this->m_tem_flag;
          this->m_tem_flag = uVar11 ^ 1;
          uVar14 = 0xd9;
          if (uVar11 == 0) {
            uVar14 = 0xff;
          }
LAB_0011efff:
          prep_in_buffer(this);
          iVar5 = this->m_in_buf_left;
          if (iVar5 != 0) {
            pbVar8 = this->m_pIn_buf_ofs;
            goto LAB_0011f01c;
          }
          uVar6 = this->m_tem_flag;
          this->m_tem_flag = uVar6 ^ 1;
          uVar11 = 0xd9;
          if (uVar6 == 0) {
            uVar11 = 0xff;
          }
        }
        else {
LAB_0011efb2:
          pbVar3 = this->m_pIn_buf_ofs;
          pbVar8 = pbVar3 + 1;
          this->m_pIn_buf_ofs = pbVar8;
          uVar14 = (uint)*pbVar3;
          iVar5 = iVar5 + -1;
          this->m_in_buf_left = iVar5;
          if (iVar5 == 0) goto LAB_0011efff;
LAB_0011f01c:
          this->m_pIn_buf_ofs = pbVar8 + 1;
          bVar1 = *pbVar8;
          this->m_in_buf_left = iVar5 + -1;
          uVar11 = (uint)bVar1;
        }
        uVar14 = (uVar14 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar11) <<
                 (-(char)this->m_bits_left & 0x1fU);
        iVar5 = this->m_bits_left + 0x10;
      }
      else {
        uVar14 = uVar13 << 8;
      }
      this->m_bits_left = iVar5 + -8;
      if (iVar5 < 9) {
        this->m_bit_buf = uVar14 << ((byte)iVar5 & 0x1f);
        iVar5 = this->m_in_buf_left;
        if (iVar5 == 0) {
          prep_in_buffer(this);
          iVar5 = this->m_in_buf_left;
          if (iVar5 != 0) goto LAB_0011f08d;
          uVar6 = this->m_tem_flag;
          this->m_tem_flag = uVar6 ^ 1;
          uVar11 = 0xd9;
          if (uVar6 == 0) {
            uVar11 = 0xff;
          }
LAB_0011f107:
          prep_in_buffer(this);
          iVar5 = this->m_in_buf_left;
          if (iVar5 != 0) {
            pbVar8 = this->m_pIn_buf_ofs;
            goto LAB_0011f124;
          }
          uVar2 = this->m_tem_flag;
          this->m_tem_flag = uVar2 ^ 1;
          uVar6 = 0xd9;
          if (uVar2 == 0) {
            uVar6 = 0xff;
          }
        }
        else {
LAB_0011f08d:
          pbVar3 = this->m_pIn_buf_ofs;
          pbVar8 = pbVar3 + 1;
          this->m_pIn_buf_ofs = pbVar8;
          uVar11 = (uint)*pbVar3;
          iVar5 = iVar5 + -1;
          this->m_in_buf_left = iVar5;
          if (iVar5 == 0) goto LAB_0011f107;
LAB_0011f124:
          this->m_pIn_buf_ofs = pbVar8 + 1;
          bVar1 = *pbVar8;
          this->m_in_buf_left = iVar5 + -1;
          uVar6 = (uint)bVar1;
        }
        this->m_bit_buf =
             (uVar11 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar6) <<
             (-(char)this->m_bits_left & 0x1fU);
        this->m_bits_left = this->m_bits_left + 0x10;
      }
      else {
        this->m_bit_buf = uVar14 << 8;
      }
      if ((long)this->m_comps_in_frame < 1) {
LAB_0011f7b4:
        stop_decoding(this,JPGD_BAD_SOS_COMP_ID);
      }
      lVar7 = 0;
      while (uVar13 >> 0x18 != this->m_comp_ident[lVar7]) {
        lVar7 = lVar7 + 1;
        if (this->m_comps_in_frame == lVar7) goto LAB_0011f7b4;
      }
      this->m_comp_list[uVar15] = (int)lVar7;
      this->m_comp_dc_tab[lVar7] = uVar14 >> 0x1c;
      this->m_comp_ac_tab[lVar7] = (uVar14 >> 0x18 & 0xf) + 4;
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar10);
    iVar5 = this->m_bits_left;
    uVar12 = this->m_bit_buf;
  }
  iVar9 = iVar5 + -8;
  this->m_bits_left = iVar9;
  if (iVar5 < 9) {
    this->m_bit_buf = uVar12 << ((byte)iVar5 & 0x1f);
    iVar5 = this->m_in_buf_left;
    if (iVar5 == 0) {
      prep_in_buffer(this);
      iVar5 = this->m_in_buf_left;
      if (iVar5 != 0) goto LAB_0011f240;
      uVar14 = this->m_tem_flag;
      this->m_tem_flag = uVar14 ^ 1;
      uVar13 = 0xd9;
      if (uVar14 == 0) {
        uVar13 = 0xff;
      }
LAB_0011f2b2:
      prep_in_buffer(this);
      iVar5 = this->m_in_buf_left;
      if (iVar5 != 0) {
        pbVar8 = this->m_pIn_buf_ofs;
        goto LAB_0011f2cf;
      }
      uVar10 = this->m_tem_flag;
      this->m_tem_flag = uVar10 ^ 1;
      uVar14 = 0xd9;
      if (uVar10 == 0) {
        uVar14 = 0xff;
      }
    }
    else {
LAB_0011f240:
      pbVar3 = this->m_pIn_buf_ofs;
      pbVar8 = pbVar3 + 1;
      this->m_pIn_buf_ofs = pbVar8;
      uVar13 = (uint)*pbVar3;
      iVar5 = iVar5 + -1;
      this->m_in_buf_left = iVar5;
      if (iVar5 == 0) goto LAB_0011f2b2;
LAB_0011f2cf:
      this->m_pIn_buf_ofs = pbVar8 + 1;
      bVar1 = *pbVar8;
      this->m_in_buf_left = iVar5 + -1;
      uVar14 = (uint)bVar1;
    }
    uVar13 = (uVar13 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar14) <<
             (-(char)this->m_bits_left & 0x1fU);
    iVar9 = this->m_bits_left + 0x10;
  }
  else {
    uVar13 = uVar12 << 8;
  }
  this->m_spectral_start = uVar12 >> 0x18;
  iVar5 = iVar9 + -8;
  this->m_bits_left = iVar5;
  if (iVar9 < 9) {
    this->m_bit_buf = uVar13 << ((byte)iVar9 & 0x1f);
    iVar5 = this->m_in_buf_left;
    if (iVar5 == 0) {
      prep_in_buffer(this);
      iVar5 = this->m_in_buf_left;
      if (iVar5 != 0) goto LAB_0011f34d;
      uVar10 = this->m_tem_flag;
      this->m_tem_flag = uVar10 ^ 1;
      uVar14 = 0xd9;
      if (uVar10 == 0) {
        uVar14 = 0xff;
      }
LAB_0011f3bf:
      prep_in_buffer(this);
      iVar5 = this->m_in_buf_left;
      if (iVar5 != 0) {
        pbVar8 = this->m_pIn_buf_ofs;
        goto LAB_0011f3dc;
      }
      uVar11 = this->m_tem_flag;
      this->m_tem_flag = uVar11 ^ 1;
      uVar10 = 0xd9;
      if (uVar11 == 0) {
        uVar10 = 0xff;
      }
    }
    else {
LAB_0011f34d:
      pbVar3 = this->m_pIn_buf_ofs;
      pbVar8 = pbVar3 + 1;
      this->m_pIn_buf_ofs = pbVar8;
      uVar14 = (uint)*pbVar3;
      iVar5 = iVar5 + -1;
      this->m_in_buf_left = iVar5;
      if (iVar5 == 0) goto LAB_0011f3bf;
LAB_0011f3dc:
      this->m_pIn_buf_ofs = pbVar8 + 1;
      bVar1 = *pbVar8;
      this->m_in_buf_left = iVar5 + -1;
      uVar10 = (uint)bVar1;
    }
    uVar14 = (uVar14 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar10) <<
             (-(char)this->m_bits_left & 0x1fU);
    iVar5 = this->m_bits_left + 0x10;
  }
  else {
    uVar14 = uVar13 << 8;
  }
  this->m_spectral_end = uVar13 >> 0x18;
  iVar9 = iVar5 + -4;
  this->m_bits_left = iVar9;
  if (iVar5 < 5) {
    this->m_bit_buf = uVar14 << ((byte)iVar5 & 0x1f);
    iVar5 = this->m_in_buf_left;
    if (iVar5 == 0) {
      prep_in_buffer(this);
      iVar5 = this->m_in_buf_left;
      if (iVar5 != 0) goto LAB_0011f45a;
      uVar10 = this->m_tem_flag;
      this->m_tem_flag = uVar10 ^ 1;
      uVar13 = 0xd9;
      if (uVar10 == 0) {
        uVar13 = 0xff;
      }
LAB_0011f4cc:
      prep_in_buffer(this);
      iVar5 = this->m_in_buf_left;
      if (iVar5 != 0) {
        pbVar8 = this->m_pIn_buf_ofs;
        goto LAB_0011f4e9;
      }
      uVar11 = this->m_tem_flag;
      this->m_tem_flag = uVar11 ^ 1;
      uVar10 = 0xd9;
      if (uVar11 == 0) {
        uVar10 = 0xff;
      }
    }
    else {
LAB_0011f45a:
      pbVar3 = this->m_pIn_buf_ofs;
      pbVar8 = pbVar3 + 1;
      this->m_pIn_buf_ofs = pbVar8;
      uVar13 = (uint)*pbVar3;
      iVar5 = iVar5 + -1;
      this->m_in_buf_left = iVar5;
      if (iVar5 == 0) goto LAB_0011f4cc;
LAB_0011f4e9:
      this->m_pIn_buf_ofs = pbVar8 + 1;
      bVar1 = *pbVar8;
      this->m_in_buf_left = iVar5 + -1;
      uVar10 = (uint)bVar1;
    }
    uVar13 = (uVar13 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar10) <<
             (-(char)this->m_bits_left & 0x1fU);
    iVar9 = this->m_bits_left + 0x10;
  }
  else {
    uVar13 = uVar14 << 4;
  }
  this->m_successive_high = uVar14 >> 0x1c;
  iVar5 = iVar9 + -4;
  this->m_bits_left = iVar5;
  if (4 < iVar9) {
    uVar12 = uVar13 << 4;
    this->m_bit_buf = uVar12;
    goto LAB_0011f644;
  }
  this->m_bit_buf = uVar13 << ((byte)iVar9 & 0x1f);
  iVar5 = this->m_in_buf_left;
  if (iVar5 == 0) {
    prep_in_buffer(this);
    iVar5 = this->m_in_buf_left;
    if (iVar5 != 0) goto LAB_0011f567;
    uVar10 = this->m_tem_flag;
    this->m_tem_flag = uVar10 ^ 1;
    uVar14 = 0xd9;
    if (uVar10 == 0) {
      uVar14 = 0xff;
    }
LAB_0011f5e0:
    prep_in_buffer(this);
    iVar5 = this->m_in_buf_left;
    if (iVar5 != 0) {
      pbVar8 = this->m_pIn_buf_ofs;
      goto LAB_0011f5fd;
    }
    uVar11 = this->m_tem_flag;
    this->m_tem_flag = uVar11 ^ 1;
    uVar10 = 0xd9;
    if (uVar11 == 0) {
      uVar10 = 0xff;
    }
  }
  else {
LAB_0011f567:
    pbVar3 = this->m_pIn_buf_ofs;
    pbVar8 = pbVar3 + 1;
    this->m_pIn_buf_ofs = pbVar8;
    uVar14 = (uint)*pbVar3;
    iVar5 = iVar5 + -1;
    this->m_in_buf_left = iVar5;
    if (iVar5 == 0) goto LAB_0011f5e0;
LAB_0011f5fd:
    this->m_pIn_buf_ofs = pbVar8 + 1;
    bVar1 = *pbVar8;
    this->m_in_buf_left = iVar5 + -1;
    uVar10 = (uint)bVar1;
  }
  uVar12 = (uVar14 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar10) <<
           (-(char)this->m_bits_left & 0x1fU);
  this->m_bit_buf = uVar12;
  iVar5 = this->m_bits_left + 0x10;
  this->m_bits_left = iVar5;
LAB_0011f644:
  this->m_successive_low = uVar13 >> 0x1c;
  if (this->m_progressive_flag == 0) {
    this->m_spectral_start = 0;
    this->m_spectral_end = 0x3f;
  }
  iVar4 = iVar4 + -3;
  do {
    if (iVar4 == 0) {
      return;
    }
    iVar9 = iVar5 + -8;
    this->m_bits_left = iVar9;
    if (iVar5 < 9) {
      this->m_bit_buf = uVar12 << ((byte)iVar5 & 0x1f);
      iVar5 = this->m_in_buf_left;
      if (iVar5 == 0) {
        prep_in_buffer(this);
        iVar5 = this->m_in_buf_left;
        if (iVar5 != 0) goto LAB_0011f6aa;
        uVar14 = this->m_tem_flag;
        this->m_tem_flag = uVar14 ^ 1;
        uVar13 = 0xd9;
        if (uVar14 == 0) {
          uVar13 = 0xff;
        }
LAB_0011f6f6:
        prep_in_buffer(this);
        iVar5 = this->m_in_buf_left;
        if (iVar5 != 0) {
          pbVar8 = this->m_pIn_buf_ofs;
          goto LAB_0011f70f;
        }
        uVar10 = this->m_tem_flag;
        this->m_tem_flag = uVar10 ^ 1;
        uVar14 = 0xd9;
        if (uVar10 == 0) {
          uVar14 = 0xff;
        }
      }
      else {
LAB_0011f6aa:
        pbVar3 = this->m_pIn_buf_ofs;
        pbVar8 = pbVar3 + 1;
        this->m_pIn_buf_ofs = pbVar8;
        uVar13 = (uint)*pbVar3;
        iVar5 = iVar5 + -1;
        this->m_in_buf_left = iVar5;
        if (iVar5 == 0) goto LAB_0011f6f6;
LAB_0011f70f:
        this->m_pIn_buf_ofs = pbVar8 + 1;
        uVar14 = (uint)*pbVar8;
        this->m_in_buf_left = iVar5 + -1;
      }
      uVar12 = (uVar13 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar14) <<
               (-(char)this->m_bits_left & 0x1fU);
      this->m_bit_buf = uVar12;
      iVar9 = this->m_bits_left + 0x10;
      this->m_bits_left = iVar9;
    }
    else {
      uVar12 = uVar12 << 8;
      this->m_bit_buf = uVar12;
    }
    iVar4 = iVar4 + -1;
    iVar5 = iVar9;
  } while( true );
}

Assistant:

void jpeg_decoder::read_sos_marker() {
  uint num_left;
  int i, ci, n, c, cc;

  num_left = get_bits(16);

  n = get_bits(8);

  m_comps_in_scan = n;

  num_left -= 3;

  if ((num_left != (uint)(n * 2 + 3)) || (n < 1) || (n > JPGD_MAX_COMPS_IN_SCAN))
    stop_decoding(JPGD_BAD_SOS_LENGTH);

  for (i = 0; i < n; i++) {
    cc = get_bits(8);
    c = get_bits(8);
    num_left -= 2;

    for (ci = 0; ci < m_comps_in_frame; ci++)
      if (cc == m_comp_ident[ci])
        break;

    if (ci >= m_comps_in_frame)
      stop_decoding(JPGD_BAD_SOS_COMP_ID);

    m_comp_list[i] = ci;
    m_comp_dc_tab[ci] = (c >> 4) & 15;
    m_comp_ac_tab[ci] = (c & 15) + (JPGD_MAX_HUFF_TABLES >> 1);
  }

  m_spectral_start = get_bits(8);
  m_spectral_end = get_bits(8);
  m_successive_high = get_bits(4);
  m_successive_low = get_bits(4);

  if (!m_progressive_flag) {
    m_spectral_start = 0;
    m_spectral_end = 63;
  }

  num_left -= 3;

  while (num_left) /* read past whatever is num_left */
  {
    get_bits(8);
    num_left--;
  }
}